

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O1

void __thiscall
amrex::MFNodeBilinear::interp
          (MFNodeBilinear *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  bool bVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  MFIter mfi;
  ulong local_220;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&finemf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&crsemf->super_FabArray<amrex::FArrayBox>,&local_90);
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar15 = local_12c.smallend.vect[1] - ng->vect[1];
      uVar22 = ng->vect[1] + local_12c.bigend.vect[1];
      uVar20 = local_12c.smallend.vect[2] - ng->vect[2];
      uVar26 = ng->vect[2] + local_12c.bigend.vect[2];
      uVar2 = (dest_domain->smallend).vect[1];
      if ((int)uVar15 <= (int)uVar2) {
        uVar15 = uVar2;
      }
      uVar2 = (dest_domain->smallend).vect[2];
      if ((int)uVar20 <= (int)uVar2) {
        uVar20 = uVar2;
      }
      uVar2 = (dest_domain->bigend).vect[1];
      if ((int)uVar2 <= (int)uVar22) {
        uVar22 = uVar2;
      }
      uVar2 = (dest_domain->bigend).vect[2];
      if ((int)uVar2 <= (int)uVar26) {
        uVar26 = uVar2;
      }
      if (0 < nc) {
        iVar37 = (dest_domain->smallend).vect[0];
        uVar2 = (dest_domain->bigend).vect[0];
        iVar3 = ratio->vect[0];
        iVar4 = ratio->vect[1];
        iVar21 = local_12c.smallend.vect[0] - ng->vect[0];
        uVar23 = ng->vect[0] + local_12c.bigend.vect[0];
        iVar5 = ratio->vect[2];
        if ((int)uVar2 <= (int)uVar23) {
          uVar23 = uVar2;
        }
        if (iVar21 <= iVar37) {
          iVar21 = iVar37;
        }
        dVar41 = 1.0 / (double)iVar3;
        dVar42 = 1.0 / (double)iVar4;
        dVar39 = 1.0 / (double)iVar5;
        local_220 = 0;
        do {
          if ((int)uVar20 <= (int)uVar26) {
            lVar19 = (local_220 + (long)ccomp) * local_110.nstride;
            uVar2 = uVar20;
            do {
              if ((int)uVar15 <= (int)uVar22) {
                uVar10 = uVar2 + 1;
                uVar16 = -uVar10;
                if (0 < (int)uVar10) {
                  uVar16 = uVar10;
                }
                uVar10 = ~(uVar16 >> 2);
                if (-1 < (int)uVar2) {
                  uVar10 = uVar2 >> 2;
                }
                uVar6 = uVar15;
                uVar28 = ~(uVar16 >> 1);
                if (-1 < (int)uVar2) {
                  uVar28 = uVar2 >> 1;
                }
                do {
                  if (iVar21 <= (int)uVar23) {
                    uVar11 = uVar6 + 1;
                    uVar17 = -uVar11;
                    if (0 < (int)uVar11) {
                      uVar17 = uVar11;
                    }
                    uVar29 = ~(uVar17 >> 1);
                    uVar11 = ~(uVar17 >> 2);
                    if (-1 < (int)uVar6) {
                      uVar29 = uVar6 >> 1;
                      uVar11 = uVar6 >> 2;
                    }
                    lVar14 = 0;
                    iVar37 = -iVar21;
                    do {
                      uVar1 = iVar21 + lVar14;
                      uVar30 = (uint)uVar1;
                      iVar18 = (int)lVar14;
                      if (iVar3 == 4) {
                        if ((long)uVar1 < 0) {
                          uVar34 = iVar21 + iVar18 + 1;
                          uVar7 = -uVar34;
                          if (0 < (int)uVar34) {
                            uVar7 = uVar34;
                          }
                          uVar7 = uVar7 >> 2;
LAB_004c91ac:
                          uVar7 = ~uVar7;
                        }
                        else {
                          uVar7 = (uint)(uVar1 >> 2) & 0x3fffffff;
                        }
                      }
                      else if (iVar3 == 2) {
                        if ((long)uVar1 < 0) {
                          uVar34 = iVar21 + iVar18 + 1;
                          uVar7 = -uVar34;
                          if (0 < (int)uVar34) {
                            uVar7 = uVar34;
                          }
                          uVar7 = uVar7 >> 1;
                          goto LAB_004c91ac;
                        }
                        uVar7 = (uint)(uVar1 >> 1) & 0x7fffffff;
                      }
                      else {
                        uVar7 = uVar30;
                        if (iVar3 != 1) {
                          if ((long)uVar1 < 0) {
                            iVar27 = iVar18 + iVar21 + 1;
                            iVar18 = -iVar27;
                            if (0 < iVar27) {
                              iVar18 = iVar27;
                            }
                            uVar7 = iVar18 / iVar3;
                            goto LAB_004c91ac;
                          }
                          uVar7 = (uint)((long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 |
                                               uVar1 & 0xffffffff) / (long)iVar3);
                        }
                      }
                      uVar34 = uVar6;
                      if (((iVar4 != 1) && (uVar34 = uVar11, iVar4 != 4)) &&
                         (uVar34 = uVar29, iVar4 != 2)) {
                        if ((int)uVar6 < 0) {
                          uVar34 = ~((int)uVar17 / iVar4);
                        }
                        else {
                          uVar34 = (int)uVar6 / iVar4;
                        }
                      }
                      uVar8 = uVar2;
                      if (((iVar5 != 1) && (uVar8 = uVar10, iVar5 != 4)) &&
                         (uVar8 = uVar28, iVar5 != 2)) {
                        if ((int)uVar2 < 0) {
                          uVar8 = ~((int)uVar16 / iVar5);
                        }
                        else {
                          uVar8 = (int)uVar2 / iVar5;
                        }
                      }
                      uVar12 = uVar7 * iVar3;
                      iVar36 = -iVar3 * uVar7 + uVar30;
                      uVar32 = uVar34 * iVar4;
                      uVar24 = uVar8 * iVar5;
                      iVar18 = uVar2 - uVar24;
                      iVar27 = uVar6 - uVar32;
                      if ((iVar27 != 0 && uVar30 != uVar12) && (uVar2 != uVar24)) {
                        lVar25 = (long)(int)(uVar7 - local_110.begin.x);
                        lVar31 = local_110.jstride * (int)(uVar34 - local_110.begin.y);
                        lVar33 = local_110.kstride * (int)(uVar8 - local_110.begin.z);
                        dVar44 = (double)(int)((uVar7 + 1) * iVar3 + iVar37);
                        dVar45 = (double)(iVar4 - iVar27);
                        dVar46 = (double)(iVar5 - iVar18);
                        lVar35 = (long)(int)((uVar7 - local_110.begin.x) + 1);
                        dVar43 = (double)iVar36;
                        lVar13 = (int)((uVar34 - local_110.begin.y) + 1) * local_110.jstride;
                        dVar47 = (double)iVar27;
                        lVar9 = (int)((uVar8 - local_110.begin.z) + 1) * local_110.kstride;
                        dVar40 = (double)iVar18;
                        dVar40 = (dVar43 * local_110.p[lVar13 + lVar35 + lVar9 + lVar19] * dVar47 *
                                  dVar40 + dVar44 * local_110.p[lVar13 + lVar25 + lVar9 + lVar19] *
                                           dVar47 * dVar40 +
                                           local_110.p[lVar31 + lVar35 + lVar9 + lVar19] * dVar43 *
                                           dVar45 * dVar40 +
                                           local_110.p[lVar31 + lVar25 + lVar9 + lVar19] * dVar44 *
                                           dVar45 * dVar40 +
                                           local_110.p[lVar13 + lVar35 + lVar33 + lVar19] * dVar43 *
                                           dVar47 * dVar46 +
                                           local_110.p[lVar13 + lVar25 + lVar33 + lVar19] * dVar44 *
                                           dVar47 * dVar46 +
                                           local_110.p[lVar31 + lVar25 + lVar33 + lVar19] * dVar44 *
                                           dVar45 * dVar46 +
                                           local_110.p[lVar31 + lVar35 + lVar33 + lVar19] * dVar43 *
                                           dVar45 * dVar46) * dVar41 * dVar42 * dVar39;
                      }
                      else if ((uVar6 == uVar32) || (uVar2 == uVar24)) {
                        if ((uVar30 == uVar12) || (uVar2 == uVar24)) {
                          if (iVar27 != 0 && uVar30 != uVar12) {
                            iVar18 = uVar7 - local_110.begin.x;
                            lVar13 = local_110.jstride * (int)(uVar34 - local_110.begin.y);
                            lVar9 = (int)(uVar8 - local_110.begin.z) * local_110.kstride;
                            dVar40 = (double)(int)((uVar7 + 1) * iVar3 + iVar37);
                            lVar25 = (int)((uVar34 - local_110.begin.y) + 1) * local_110.jstride;
                            dVar40 = ((double)iVar36 *
                                      local_110.p[lVar25 + (long)(iVar18 + 1) + lVar9 + lVar19] *
                                      (double)iVar27 +
                                     dVar40 * local_110.p[lVar25 + (long)iVar18 + lVar9 + lVar19] *
                                     (double)iVar27 +
                                     local_110.p[lVar13 + (long)iVar18 + lVar9 + lVar19] * dVar40 *
                                     (double)(iVar4 - iVar27) +
                                     local_110.p[lVar13 + (long)(iVar18 + 1) + lVar9 + lVar19] *
                                     (double)iVar36 * (double)(iVar4 - iVar27)) * dVar41 * dVar42;
                          }
                          else if (uVar30 == uVar12) {
                            if (uVar6 == uVar32) {
                              if (uVar2 == uVar24) {
                                dVar40 = local_110.p
                                         [(int)(uVar34 - local_110.begin.y) * local_110.jstride +
                                          (long)(int)(uVar7 - local_110.begin.x) +
                                          (int)(uVar8 - local_110.begin.z) * local_110.kstride +
                                          lVar19];
                              }
                              else {
                                lVar9 = (int)(uVar34 - local_110.begin.y) * local_110.jstride;
                                dVar40 = ((double)(iVar5 - iVar18) *
                                          local_110.p
                                          [lVar9 + (long)(int)(uVar7 - local_110.begin.x) +
                                                   local_110.kstride *
                                                   (int)(uVar8 - local_110.begin.z) + lVar19] +
                                         (double)iVar18 *
                                         local_110.p
                                         [lVar9 + (long)(int)(uVar7 - local_110.begin.x) +
                                                  (int)((uVar8 - local_110.begin.z) + 1) *
                                                  local_110.kstride + lVar19]) * dVar39;
                              }
                            }
                            else {
                              lVar9 = (int)(uVar8 - local_110.begin.z) * local_110.kstride;
                              dVar40 = ((double)(iVar4 - iVar27) *
                                        local_110.p
                                        [local_110.jstride * (int)(uVar34 - local_110.begin.y) +
                                         (long)(int)(uVar7 - local_110.begin.x) + lVar9 + lVar19] +
                                       (double)iVar27 *
                                       local_110.p
                                       [(int)((uVar34 - local_110.begin.y) + 1) * local_110.jstride
                                        + (long)(int)(uVar7 - local_110.begin.x) + lVar9 + lVar19])
                                       * dVar42;
                            }
                          }
                          else {
                            lVar13 = (int)(uVar34 - local_110.begin.y) * local_110.jstride;
                            lVar9 = (int)(uVar8 - local_110.begin.z) * local_110.kstride;
                            dVar40 = ((double)(int)((uVar7 + 1) * iVar3 + iVar37) *
                                      local_110.p
                                      [lVar13 + (long)(int)(uVar7 - local_110.begin.x) +
                                                lVar9 + lVar19] +
                                     (double)iVar36 *
                                     local_110.p
                                     [lVar13 + (long)(int)((uVar7 - local_110.begin.x) + 1) +
                                               lVar9 + lVar19]) * dVar41;
                          }
                        }
                        else {
                          iVar27 = uVar7 - local_110.begin.x;
                          lVar13 = (int)(uVar34 - local_110.begin.y) * local_110.jstride;
                          lVar25 = local_110.kstride * (int)(uVar8 - local_110.begin.z);
                          dVar40 = (double)(int)((uVar7 + 1) * iVar3 + iVar37);
                          lVar9 = (int)((uVar8 - local_110.begin.z) + 1) * local_110.kstride;
                          dVar40 = ((double)iVar36 *
                                    local_110.p[lVar13 + (long)(iVar27 + 1) + lVar9 + lVar19] *
                                    (double)iVar18 +
                                   dVar40 * local_110.p[lVar13 + (long)iVar27 + lVar9 + lVar19] *
                                   (double)iVar18 +
                                   local_110.p[lVar13 + (long)iVar27 + lVar25 + lVar19] * dVar40 *
                                   (double)(iVar5 - iVar18) +
                                   local_110.p[lVar13 + (long)(iVar27 + 1) + lVar25 + lVar19] *
                                   (double)iVar36 * (double)(iVar5 - iVar18)) * dVar41 * dVar39;
                        }
                      }
                      else {
                        lVar25 = (long)(int)(uVar7 - local_110.begin.x);
                        lVar13 = local_110.jstride * (int)(uVar34 - local_110.begin.y);
                        lVar33 = local_110.kstride * (int)(uVar8 - local_110.begin.z);
                        lVar31 = (int)((uVar34 - local_110.begin.y) + 1) * local_110.jstride;
                        lVar9 = (int)((uVar8 - local_110.begin.z) + 1) * local_110.kstride;
                        dVar40 = ((double)iVar27 * local_110.p[lVar31 + lVar25 + lVar9 + lVar19] *
                                  (double)iVar18 +
                                 (double)(iVar4 - iVar27) *
                                 local_110.p[lVar13 + lVar25 + lVar9 + lVar19] * (double)iVar18 +
                                 local_110.p[lVar13 + lVar25 + lVar33 + lVar19] *
                                 (double)(iVar4 - iVar27) * (double)(iVar5 - iVar18) +
                                 local_110.p[lVar31 + lVar25 + lVar33 + lVar19] * (double)iVar27 *
                                 (double)(iVar5 - iVar18)) * dVar42 * dVar39;
                      }
                      local_d0.p
                      [((long)(int)uVar6 - (long)local_d0.begin.y) * local_d0.jstride +
                       ((long)(int)uVar2 - (long)local_d0.begin.z) * local_d0.kstride +
                       ((long)fcomp + local_220) * local_d0.nstride +
                       ((iVar21 + lVar14) - (long)local_d0.begin.x)] = dVar40;
                      lVar14 = lVar14 + 1;
                      iVar37 = iVar37 + -1;
                    } while (~uVar23 + iVar21 + (int)lVar14 != 0);
                  }
                  bVar38 = uVar6 != uVar22;
                  uVar6 = uVar6 + 1;
                } while (bVar38);
              }
              bVar38 = uVar2 != uVar26;
              uVar2 = uVar2 + 1;
            } while (bVar38);
          }
          local_220 = local_220 + 1;
        } while (local_220 != (uint)nc);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFNodeBilinear::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                        IntVect const& ng, Geometry const&, Geometry const&,
                        Box const& dest_domain, IntVect const& ratio,
                        Vector<BCRec> const&, int)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                mf_nodebilin_interp(i,j,k,n, fine[box_no], fcomp, crse[box_no], ccomp, ratio);
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            amrex::LoopConcurrentOnCpu(fbox, nc,
            [=] (int i, int j, int k, int n) noexcept
            {
                mf_nodebilin_interp(i,j,k,n, fine, fcomp, crse, ccomp, ratio);
            });
        }
    }
}